

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

void eputi(int i,int r)

{
  int q;
  int r_local;
  int i_local;
  
  q = i;
  if (i < 0) {
    eputc('-');
    q = -i;
  }
  if (q / r != 0) {
    eputi(q / r,r);
  }
  eputc((char)(q % r) + '0');
  return;
}

Assistant:

static void
eputi(int i, int r)
{
	int	 q;

	if (i < 0) {
		eputc('-');
		i = -i;
	}
	if ((q = i / r) != 0)
		eputi(q, r);
	eputc(i % r + '0');
}